

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_interface_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  InterfaceRef *this_00;
  bool bVar1;
  uint uVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
  *this_01;
  reference __in;
  type *__args;
  type *ptVar3;
  element_type *peVar4;
  ostream *poVar5;
  Var *this_02;
  element_type *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  *this_04;
  element_type *peVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_05;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_06;
  reference pbVar7;
  size_type sVar8;
  Port *port;
  Var *var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar9 [16];
  string_view format_str;
  format_args args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  reference local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_1;
  iterator __end3_2;
  iterator __begin3_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  uint32_t count;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputs;
  string local_520;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ports;
  type *mod_port;
  type *mod_name;
  _Self local_4b0;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  *__range2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  *mod_ports;
  shared_ptr<kratos::InterfaceDefinition> interface_definition;
  Var *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_408;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vars;
  SystemVerilogCodeGen *local_3e0;
  Port *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_3b0 [4];
  uint32_t i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  stringstream local_350 [8];
  stringstream stream;
  shared_ptr<kratos::IDefinition> *i_def;
  InterfaceRef *i_ref;
  type *def;
  type *interface_name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
  local_1a0;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
  *__range1;
  string local_180 [8];
  string indent;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
  *defs;
  undefined1 local_140 [8];
  InterfaceVisitor visitor;
  Generator *top_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  InterfaceVisitor::InterfaceVisitor((InterfaceVisitor *)local_140);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_140,
             (Generator *)visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next);
  this_01 = InterfaceVisitor::interfaces_abi_cxx11_((InterfaceVisitor *)local_140);
  indent.field_2._M_local_buf[0xf] = '\0';
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"  ",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
           ::begin(this_01);
  local_1a0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
       ::end(this_01);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                       ,&local_1a0);
    if (!bVar1) {
      indent.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::~string(local_180);
      if ((indent.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map(__return_storage_ptr__);
      }
      InterfaceVisitor::~InterfaceVisitor((InterfaceVisitor *)local_140);
      return __return_storage_ptr__;
    }
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_false,_true>
           ::operator*(&__end1);
    __args = std::
             get<0ul,std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>
                       (__in);
    ptVar3 = std::
             get<1ul,std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>
                       (__in);
    this_00 = ptVar3->second;
    stream._384_8_ = InterfaceRef::definition(this_00);
    peVar4 = std::__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stream._384_8_);
    uVar2 = (*peVar4->_vptr_IDefinition[8])();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_350);
      poVar5 = std::operator<<((ostream *)&stream.field_0x8,"interface ");
      std::operator<<(poVar5,(string *)__args);
      peVar4 = std::
               __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stream._384_8_);
      (*peVar4->_vptr_IDefinition[4])(&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,";");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,"(");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        peVar4 = std::
                 __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stream._384_8_);
        (*peVar4->_vptr_IDefinition[4])(local_3b0);
        __range3._4_4_ = 0;
        __end3 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3b0);
        port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3b0);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&port_name), bVar1) {
          p = (Port *)std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end3);
          local_3e0 = (SystemVerilogCodeGen *)InterfaceRef::port(this_00,(string *)p);
          poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_180);
          SystemVerilogCodeGen::get_port_str_abi_cxx11_((string *)&vars,local_3e0,port);
          std::operator<<(poVar5,(string *)&vars);
          std::__cxx11::string::~string((string *)&vars);
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3b0);
          if ((ulong)__range3._4_4_ == sVar8 - 1) {
            std::ostream::operator<<(&stream.field_0x8,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar5 = std::operator<<((ostream *)&stream.field_0x8,",");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end3);
          __range3._4_4_ = __range3._4_4_ + 1;
        }
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,");");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b0);
      }
      peVar4 = std::
               __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stream._384_8_);
      (*peVar4->_vptr_IDefinition[5])(&__range2);
      local_408 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2;
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      var_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&var_name), bVar1) {
        pbVar7 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        this_02 = InterfaceRef::var(this_00,pbVar7);
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_180);
        Stream::get_var_decl_abi_cxx11_
                  ((string *)
                   &interface_definition.
                    super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Stream *)this_02,var);
        poVar5 = std::operator<<(poVar5,(string *)
                                        &interface_definition.
                                         super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
        poVar5 = std::operator<<(poVar5,";");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)
                   &interface_definition.
                    super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      std::static_pointer_cast<kratos::InterfaceDefinition,kratos::IDefinition>
                ((shared_ptr<kratos::IDefinition> *)&mod_ports);
      this_03 = std::
                __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&mod_ports);
      this_04 = InterfaceDefinition::mod_ports_abi_cxx11_(this_03);
      __end2_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                 ::begin(this_04);
      local_4b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
           ::end(this_04);
      while (bVar1 = std::operator!=(&__end2_1,&local_4b0), bVar1) {
        mod_name = &std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>
                    ::operator*(&__end2_1)->first;
        mod_port = (type *)std::
                           get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>
                                     ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
                                       *)mod_name);
        ports = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceModPortDefinition>>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
                               *)mod_name);
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_180);
        poVar5 = std::operator<<(poVar5,"modport ");
        poVar5 = std::operator<<(poVar5,(string *)mod_port);
        std::operator<<(poVar5,"(");
        peVar6 = std::
                 __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ports);
        (*(peVar6->super_IDefinition)._vptr_IDefinition[4])(&local_500);
        local_4d0 = &local_500;
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_4d0);
        if (bVar1) {
          auVar9 = __cxa_allocate_exception(0x10);
          local_38 = &local_520;
          local_40 = "{0} is empty";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)mod_port;
          local_68.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string_const&,char[13],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x445112,(v7 *)mod_port,auVar9._8_8_,
                          (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)0x445112);
          local_50 = &local_68;
          local_78 = fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&result;
          local_30 = local_50;
          local_20 = local_50;
          local_10 = local_50;
          local_18 = local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_50->string);
          format_str.size_ = (size_t)result;
          format_str.data_ = (char *)local_78.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_80.values_;
          fmt::v7::detail::vformat_abi_cxx11_(&local_520,(detail *)local_78.data_,format_str,args);
          UserException::UserException(auVar9._0_8_,&local_520);
          __cxa_throw(auVar9._0_8_,&UserException::typeinfo,UserException::~UserException);
        }
        peVar6 = std::
                 __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ports);
        this_05 = InterfaceModPortDefinition::inputs_abi_cxx11_(peVar6);
        peVar6 = std::
                 __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ports);
        this_06 = InterfaceModPortDefinition::outputs_abi_cxx11_(peVar6);
        __range3_1._4_4_ = 0;
        __end3_1 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_05);
        name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_05);
        while (bVar1 = std::operator!=(&__end3_1,(_Self *)&name), bVar1) {
          pbVar7 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end3_1);
          poVar5 = std::operator<<((ostream *)&stream.field_0x8,"input ");
          std::operator<<(poVar5,(string *)pbVar7);
          __range3_1._4_4_ = __range3_1._4_4_ + 1;
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_4d0);
          if (__range3_1._4_4_ != sVar8) {
            std::operator<<((ostream *)&stream.field_0x8,", ");
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end3_1);
        }
        __end3_2 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_06);
        name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_06);
        while (bVar1 = std::operator!=(&__end3_2,(_Self *)&name_1), bVar1) {
          local_580 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end3_2);
          poVar5 = std::operator<<((ostream *)&stream.field_0x8,"output ");
          std::operator<<(poVar5,(string *)local_580);
          __range3_1._4_4_ = __range3_1._4_4_ + 1;
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_4d0);
          if (__range3_1._4_4_ != sVar8) {
            std::operator<<((ostream *)&stream.field_0x8,", ");
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end3_2);
        }
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,");");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set(&local_500);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>
        ::operator++(&__end2_1);
      }
      poVar5 = std::operator<<((ostream *)&stream.field_0x8,"endinterface");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<std::__cxx11::string_const&,std::__cxx11::string>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,__args,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::shared_ptr<kratos::InterfaceDefinition>::~shared_ptr
                ((shared_ptr<kratos::InterfaceDefinition> *)&mod_ports);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
      std::__cxx11::stringstream::~stringstream(local_350);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_false,_true>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::map<std::string, std::string> extract_interface_info(Generator* top) {
    InterfaceVisitor visitor;
    visitor.visit_generator_root_p(top);
    auto const& defs = visitor.interfaces();
    std::map<std::string, std::string> result;
    const std::string indent = "  ";
    for (auto const& [interface_name, def] : defs) {
        const auto* i_ref = def.second;
        auto const& i_def = i_ref->definition();
        if (i_def->is_modport())
            // don't generate mod port definition
            continue;
        std::stringstream stream;
        stream << "interface " << interface_name;
        if (!i_def->ports().empty()) {
            stream << "(" << std::endl;
            auto port_names = i_def->ports();
            uint32_t i = 0;
            for (auto const& port_name : port_names) {
                auto* p = &i_ref->port(port_name);
                stream << indent << SystemVerilogCodeGen::get_port_str(p);
                if (i++ == port_names.size() - 1)
                    stream << std::endl;
                else
                    stream << "," << std::endl;
            }
            stream << ");" << std::endl;
        } else {
            stream << ";" << std::endl;
        }
        // output vars
        auto const& vars = i_def->vars();
        for (auto const& var_name : vars) {
            auto* v = &i_ref->var(var_name);
            stream << indent << Stream::get_var_decl(v) << ";" << std::endl;
        }

        // modports
        auto interface_definition = std::static_pointer_cast<InterfaceDefinition>(i_def);
        auto const& mod_ports = interface_definition->mod_ports();
        for (auto const& [mod_name, mod_port] : mod_ports) {
            stream << indent << "modport " << mod_name << "(";
            auto const& ports = mod_port->ports();
            if (ports.empty()) throw UserException(::format("{0} is empty", mod_name));
            auto const& inputs = mod_port->inputs();
            auto const& outputs = mod_port->outputs();
            uint32_t count = 0;
            for (auto const& name : inputs) {
                stream << "input " << name;
                if (++count != ports.size()) stream << ", ";
            }
            for (auto const& name : outputs) {
                stream << "output " << name;
                if (++count != ports.size()) stream << ", ";
            }
            stream << ");" << std::endl;
        }
        stream << "endinterface" << std::endl;
        result.emplace(interface_name, stream.str());
    }
    return result;
}